

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

Noise * __thiscall NoiseSource::createNoise(NoiseSource *this,int n,string *type)

{
  Noise *pNVar1;
  int iVar2;
  ostream *poVar3;
  WienerNoise *this_00;
  stringstream name;
  string local_210;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  if (this->aNoises[n] != (Noise *)0x0) goto LAB_0013c80b;
  std::__cxx11::stringstream::stringstream(local_1b0);
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Wiener process",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,n);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::ostream::flush();
    this_00 = (WienerNoise *)operator_new(0x180);
    std::__cxx11::stringbuf::str();
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"Correlated Wiener Process","");
    WienerNoise::WienerNoise(this_00,this,n,&local_1f0,&local_210);
LAB_0013c765:
    this->aNoises[n] = &this_00->super_Noise;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Poisson process",0xf)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,n);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      std::ostream::flush();
      this_00 = (WienerNoise *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"Correlated Poisson Process","");
      PoissonNoise::PoissonNoise((PoissonNoise *)this_00,this,n,&local_1f0,&local_210);
      goto LAB_0013c765;
    }
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Ornstein-Uhlenbeck process not implemented yet.",0x2f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Wiener process",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,n);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      std::ostream::flush();
      this_00 = (WienerNoise *)operator_new(0x180);
      std::__cxx11::stringbuf::str();
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"Correlated Wiener Process","");
      WienerNoise::WienerNoise(this_00,this,n,&local_1f0,&local_210);
      goto LAB_0013c765;
    }
  }
  pNVar1 = this->aNoises[n];
  if (pNVar1 != (Noise *)0x0) {
    std::__cxx11::stringbuf::str();
    (*(pNVar1->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
      [0xc])(pNVar1,local_1d0);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0],local_1c0[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
LAB_0013c80b:
  return this->aNoises[n];
}

Assistant:

Noise *NoiseSource::createNoise( int n, const string &type )
{
	if( !aNoises[n] ) {
		stringstream name;
		if (type=="Correlated Wiener Process") {
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		else if (type=="Correlated Poisson Process") {
			name << "Poisson process" << "[" << n << "]" << flush;
			aNoises[n] = new PoissonNoise(this, n, name.str());
		}
		else if (type=="Correlated Ornstein-Uhlenbeck Process") {
			cout << "Ornstein-Uhlenbeck process not implemented yet." << endl;
			name << "Wiener process" << "[" << n << "]" << flush;
			aNoises[n] = new WienerNoise(this, n, name.str());
		}
		if( aNoises[n] )
			aNoises[n]->setDescription(name.str());
	}
	 
	return aNoises[n];
}